

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.cpp
# Opt level: O0

void __thiscall Mempool::print_list_content(Mempool *this,MEM_CAP index)

{
  bool bVar1;
  mapped_type *ppCVar2;
  MEM_CAP MVar3;
  MEM_CAP local_5c;
  Chunk *local_58;
  Chunk *node;
  MEM_CAP local_44;
  _Node_iterator_base<std::pair<const_int,_Chunk_*>,_false> local_40 [3];
  uint local_24;
  int cnt;
  lock_guard<std::mutex> lck;
  MEM_CAP index_local;
  Mempool *this_local;
  
  lck._M_device._4_4_ = index;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffe0,&this->mp_mutex);
  local_24 = 0;
  MVar3 = lck._M_device._4_4_;
  if ((int)lck._M_device._4_4_ < 0) {
    MVar3 = lck._M_device._4_4_ + 0x3ff;
  }
  printf("***************start to print %dkb chunk_size list data*******************\n",
         (ulong)(uint)((int)MVar3 >> 10));
  local_44 = lck._M_device._4_4_;
  local_40[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
       ::find(&this->mp_pool,(key_type *)&local_44);
  node = (Chunk *)std::
                  unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
                  ::end(&this->mp_pool);
  bVar1 = std::__detail::operator==
                    (local_40,(_Node_iterator_base<std::pair<const_int,_Chunk_*>,_false> *)&node);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("mp_pool.find(index) != mp_pool.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/mem_pool.cpp"
                  ,0x73,"void Mempool::print_list_content(MEM_CAP)");
  }
  local_5c = lck._M_device._4_4_;
  ppCVar2 = std::
            unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
            ::operator[](&this->mp_pool,(key_type *)&local_5c);
  for (local_58 = *ppCVar2; local_58 != (Chunk *)0x0; local_58 = local_58->next) {
    if ((int)local_24 < 6) {
      Chunk::print_data(local_58);
    }
    local_24 = local_24 + 1;
  }
  printf("...\n");
  printf("******************end, node cnt is %d************************\n\n",(ulong)local_24);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void Mempool::print_list_content(MEM_CAP index)
{
    lock_guard<mutex> lck(mp_mutex);
    int cnt = 0;
    printf("***************start to print %dkb chunk_size list data*******************\n", index/1024);
    assert(mp_pool.find(index) != mp_pool.end());
    Chunk *node = mp_pool[index];

    while (node)
    {
        if(cnt <= 5)
            node->print_data();
        cnt++;
        node = node->next;
    }
    printf("...\n");
    printf("******************end, node cnt is %d************************\n\n", cnt);
}